

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_94(QPDF *pdf,char *arg2)

{
  char cVar1;
  __type_conflict1 _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1a8;
  QPDFObjectHandle root_media;
  QPDFObjectHandle p5_new_bleed;
  QPDFObjectHandle p1_new_art;
  string root_media_unparse;
  QPDFObjectHandle p4_crop;
  QPDFObjectHandle p1_new_crop;
  QPDFObjectHandle p5_new_crop;
  QPDFObjectHandle p5_new_media;
  QPDFObjectHandle p4_orig_crop;
  QPDFObjectHandle p4_new_crop;
  QPDFObjectHandle p4_bleed1;
  QPDFObjectHandle p2_new_trim;
  QPDFObjectHandle p2_crop;
  QPDFObjectHandle p1_effective_media;
  QPDFObjectHandle p4_art2;
  QPDFObjectHandle p4_art1;
  QPDFObjectHandle p4_bleed2;
  QPDFObjectHandle p3_crop;
  QPDFObjectHandle p3_media;
  QPDFObjectHandle pages_root;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  long local_20;
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root_media_unparse,"/Pages",(allocator<char> *)&p5_new_bleed);
  QPDFObjectHandle::getKey((string *)&pages_root);
  std::__cxx11::string::~string((string *)&root_media_unparse);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root_media_unparse,"/MediaBox",(allocator<char> *)&bStack_1a8);
  QPDFObjectHandle::getKey((string *)&root_media);
  std::__cxx11::string::~string((string *)&root_media_unparse);
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&bStack_1a8,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&bStack_1a8);
  if (local_20 - _pages != 0x118) {
    __assert_fail("pages.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcec,"void test_94(QPDF &, const char *)");
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p1_new_art,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(_pages + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_1a8,"/MediaBox",(allocator<char> *)&p1_new_crop);
  QPDFObjectHandle::getKey((string *)&p5_new_bleed);
  cVar1 = QPDFObjectHandle::isNull();
  if (cVar1 == '\0') {
    __assert_fail("p1.getObjectHandle().getKey(\"/MediaBox\").isNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf3,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p5_new_bleed.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&bStack_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p1_new_art.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar5 = SUB81(&bStack_1a8,0);
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf5,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  bVar4 = SUB81(_pages,0);
  QPDFPageObjectHelper::getCropBox(bVar5,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getCropBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf7,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getBleedBox(bVar5,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getBleedBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf8,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getTrimBox(bVar5,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcf9,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getArtBox(bVar5,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getArtBox(false, false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfa,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getArtBox(SUB81(&p1_new_art,0),bVar4);
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
  if (!_Var2) {
    __assert_fail("p1_new_art.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfd,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_1a8);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p1_new_art);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_art.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcfe,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(&p1_new_crop,0),bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p1_new_crop);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd01,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p1_new_crop);
  if (cVar1 != '\0') {
    __assert_fail("!p1_new_crop.isSameObjectAs(p1_new_art)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd02,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
  if (!_Var2) {
    __assert_fail("p1_new_crop.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd03,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_1a8);
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd05,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getTrimBox(bVar5,bVar4);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd07,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getMediaBox(SUB81(&p1_effective_media,0));
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
  if (!_Var2) {
    __assert_fail("p1_effective_media.unparse() == root_media_unparse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0b,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_1a8);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p1_effective_media);
  if (cVar1 != '\0') {
    __assert_fail("!p1_effective_media.isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0c,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd0f,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getCropBox(SUB81(&p2_crop,0),(bool)(bVar4 + '8'));
  QPDFPageObjectHelper::getTrimBox(SUB81(&p2_new_trim,0),(bool)(bVar4 + '8'));
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparse_abi_cxx11_();
  _Var2 = std::operator==(&bStack_1a8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p5_new_bleed);
  if (!_Var2) {
    __assert_fail("p2_new_trim.unparse() == p2_crop.unparse()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd12,"void test_94(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&p5_new_bleed);
  std::__cxx11::string::~string((string *)&bStack_1a8);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p2_new_trim);
  if (cVar1 != '\0') {
    __assert_fail("!p2_new_trim.isSameObjectAs(p2_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd13,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p2.getMediaBox(false).isSameObjectAs(root_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd14,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getMediaBox(SUB81(&p3_media,0));
  QPDFPageObjectHelper::getCropBox(SUB81(&p3_crop,0),(bool)(bVar4 + 'p'));
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p3.getMediaBox(true).isSameObjectAs(p3_media)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd19,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  QPDFPageObjectHelper::getCropBox(bVar5,(bool)(bVar4 + 'p'));
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 == '\0') {
    __assert_fail("p3.getCropBox(true, true).isSameObjectAs(p3_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1a,"void test_94(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p5_new_bleed,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(_pages + 0xb0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_1a8,"/CropBox",(allocator<char> *)&p4_crop);
  QPDFObjectHandle::getKey((string *)&p4_orig_crop);
  bVar3 = (bool)(bVar4 + -0x58);
  std::__cxx11::string::~string((string *)&bStack_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p5_new_bleed.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getCropBox(SUB81(&p4_crop,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_orig_crop);
  if (cVar1 == '\0') {
    __assert_fail("p4_orig_crop.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd1f,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getBleedBox(SUB81(&p4_bleed1,0),bVar3);
  QPDFPageObjectHelper::getBleedBox(SUB81(&p4_bleed2,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_bleed1);
  if (cVar1 != '\0') {
    __assert_fail("!p4_bleed1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd22,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_bleed1);
  if (cVar1 == '\0') {
    __assert_fail("p4_bleed1.isSameObjectAs(p4_bleed2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd23,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&p4_art1,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_art1);
  if (cVar1 == '\0') {
    __assert_fail("p4_art1.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd25,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getArtBox(SUB81(&p4_art2,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_art2);
  if (cVar1 != '\0') {
    __assert_fail("!p4_art2.isSameObjectAs(p4_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd27,"void test_94(QPDF &, const char *)");
  }
  QPDFPageObjectHelper::getCropBox(SUB81(&p4_new_crop,0),bVar3);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&p4_new_crop);
  if (cVar1 != '\0') {
    __assert_fail("!p4_new_crop.isSameObjectAs(p4_orig_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd29,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 == '\0') {
    __assert_fail("p4_orig_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2a,"void test_94(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    __assert_fail("!p4_new_crop.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2b,"void test_94(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  _Var2 = std::operator==(&bStack_1a8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p5_new_bleed);
  if (!_Var2) {
    __assert_fail("p4_new_crop.unparse() == p4_orig_crop.unparseResolved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd2c,"void test_94(QPDF &, const char *)");
  }
  bVar4 = (bool)(bVar4 + -0x20);
  std::__cxx11::string::~string((string *)&p5_new_bleed);
  std::__cxx11::string::~string((string *)&bStack_1a8);
  QPDFPageObjectHelper::getMediaBox(bVar5);
  cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
  if (cVar1 != '\0') {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
    QPDFPageObjectHelper::getCropBox(bVar5,bVar4);
    cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
    if (cVar1 == '\0') {
      __assert_fail("p5.getCropBox(false, false).isSameObjectAs(root_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd30,"void test_94(QPDF &, const char *)");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
    QPDFPageObjectHelper::getBleedBox(bVar5,bVar4);
    cVar1 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&bStack_1a8);
    if (cVar1 == '\0') {
      __assert_fail("p5.getBleedBox(false, false).isSameObjectAs(root_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd31,"void test_94(QPDF &, const char *)");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_1a8._M_string_length);
    QPDFPageObjectHelper::getBleedBox(SUB81(&p5_new_bleed,0),bVar4);
    QPDFPageObjectHelper::getMediaBox(SUB81(&p5_new_media,0));
    QPDFPageObjectHelper::getCropBox(SUB81(&p5_new_crop,0),bVar4);
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_media);
    if (cVar1 != '\0') {
      __assert_fail("!p5_new_media.isSameObjectAs(root_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd35,"void test_94(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_crop);
    if (cVar1 != '\0') {
      __assert_fail("!p5_new_crop.isSameObjectAs(root_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd36,"void test_94(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_crop);
    if (cVar1 != '\0') {
      __assert_fail("!p5_new_crop.isSameObjectAs(p5_new_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd37,"void test_94(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_bleed);
    if (cVar1 != '\0') {
      __assert_fail("!p5_new_bleed.isSameObjectAs(root_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd38,"void test_94(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_bleed);
    if (cVar1 != '\0') {
      __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_media)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd39,"void test_94(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&p5_new_bleed);
    if (cVar1 == '\0') {
      QPDFObjectHandle::unparse_abi_cxx11_();
      _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
      if (!_Var2) {
        __assert_fail("p5_new_media.unparse() == root_media_unparse",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0xd3b,"void test_94(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bStack_1a8);
      QPDFObjectHandle::unparse_abi_cxx11_();
      _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&bStack_1a8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        _Var2 = std::operator==(&bStack_1a8,&root_media_unparse);
        if (_Var2) {
          std::__cxx11::string::~string((string *)&bStack_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p5_new_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p5_new_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p5_new_bleed.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_new_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_art2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_art1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_bleed2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_bleed1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p4_orig_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p3_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p3_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p2_new_trim.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p2_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p1_effective_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p1_new_crop.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p1_new_art.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
          std::__cxx11::string::~string((string *)&root_media_unparse);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&root_media.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pages_root.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return;
        }
        __assert_fail("p5_new_bleed.unparse() == root_media_unparse",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0xd3d,"void test_94(QPDF &, const char *)");
      }
      __assert_fail("p5_new_crop.unparse() == root_media_unparse",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd3c,"void test_94(QPDF &, const char *)");
    }
    __assert_fail("!p5_new_bleed.isSameObjectAs(p5_new_crop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xd3a,"void test_94(QPDF &, const char *)");
  }
  __assert_fail("p5.getMediaBox(false).isSameObjectAs(root_media)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd2f,"void test_94(QPDF &, const char *)");
}

Assistant:

static void
test_94(QPDF& pdf, char const* arg2)
{
    // Exercise methods to get page boxes. This test is built for
    // boxes2.pdf.

    // /MediaBox is present in the pages tree root.
    // Each page has the following boxes present directly:
    // 1. none
    // 2. crop
    // 3. media, crop
    // 4. media, crop, trim, bleed; crop is indirect
    // 5. trim, art

    auto pages_root = pdf.getRoot().getKey("/Pages");
    auto root_media = pages_root.getKey("/MediaBox");
    auto root_media_unparse = root_media.unparse();
    auto pages = QPDFPageDocumentHelper(pdf).getAllPages();
    assert(pages.size() == 5);
    auto& p1 = pages[0];
    auto& p2 = pages[1];
    auto& p3 = pages[2];
    auto& p4 = pages[3];
    auto& p5 = pages[4];

    assert(p1.getObjectHandle().getKey("/MediaBox").isNull());
    // MediaBox not present, so get inherited one
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Other boxesBox not present, so fall back to MediaBox
    assert(p1.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p1.getBleedBox(false, false).isSameObjectAs(root_media));
    assert(p1.getTrimBox(false, false).isSameObjectAs(root_media));
    assert(p1.getArtBox(false, false).isSameObjectAs(root_media));
    // Make copy of artbox
    auto p1_new_art = p1.getArtBox(false, true);
    assert(p1_new_art.unparse() == root_media_unparse);
    assert(!p1_new_art.isSameObjectAs(root_media));
    // This also copied cropbox
    auto p1_new_crop = p1.getCropBox(false, false);
    assert(!p1_new_crop.isSameObjectAs(root_media));
    assert(!p1_new_crop.isSameObjectAs(p1_new_art));
    assert(p1_new_crop.unparse() == root_media_unparse);
    // But it didn't copy Media
    assert(p1.getMediaBox(false).isSameObjectAs(root_media));
    // Now fall back to new crop
    assert(p1.getTrimBox(false, false).isSameObjectAs(p1_new_crop));
    // Request copy. The value returned has the same structure but is
    // a different object.
    auto p1_effective_media = p1.getMediaBox(true);
    assert(p1_effective_media.unparse() == root_media_unparse);
    assert(!p1_effective_media.isSameObjectAs(root_media));

    // copy_on_fallback didn't have to copy media to crop
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));
    auto p2_crop = p2.getCropBox(false, false);
    auto p2_new_trim = p2.getTrimBox(false, true);
    assert(p2_new_trim.unparse() == p2_crop.unparse());
    assert(!p2_new_trim.isSameObjectAs(p2_crop));
    assert(p2.getMediaBox(false).isSameObjectAs(root_media));

    // We didn't need to copy anything
    auto p3_media = p3.getMediaBox(false);
    auto p3_crop = p3.getCropBox(false, false);
    assert(p3.getMediaBox(true).isSameObjectAs(p3_media));
    assert(p3.getCropBox(true, true).isSameObjectAs(p3_crop));

    // We didn't have to copy for bleed but we did for art
    auto p4_orig_crop = p4.getObjectHandle().getKey("/CropBox");
    auto p4_crop = p4.getCropBox(false, false);
    assert(p4_orig_crop.isSameObjectAs(p4_crop));
    auto p4_bleed1 = p4.getBleedBox(false, false);
    auto p4_bleed2 = p4.getBleedBox(false, true);
    assert(!p4_bleed1.isSameObjectAs(p4_crop));
    assert(p4_bleed1.isSameObjectAs(p4_bleed2));
    auto p4_art1 = p4.getArtBox(false, false);
    assert(p4_art1.isSameObjectAs(p4_crop));
    auto p4_art2 = p4.getArtBox(false, true);
    assert(!p4_art2.isSameObjectAs(p4_crop));
    auto p4_new_crop = p4.getCropBox(true, false);
    assert(!p4_new_crop.isSameObjectAs(p4_orig_crop));
    assert(p4_orig_crop.isIndirect());
    assert(!p4_new_crop.isIndirect());
    assert(p4_new_crop.unparse() == p4_orig_crop.unparseResolved());

    // Exercise copying for inheritance and fallback
    assert(p5.getMediaBox(false).isSameObjectAs(root_media));
    assert(p5.getCropBox(false, false).isSameObjectAs(root_media));
    assert(p5.getBleedBox(false, false).isSameObjectAs(root_media));
    auto p5_new_bleed = p5.getBleedBox(true, true);
    auto p5_new_media = p5.getMediaBox(false);
    auto p5_new_crop = p5.getCropBox(false, false);
    assert(!p5_new_media.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(root_media));
    assert(!p5_new_crop.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(root_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_media));
    assert(!p5_new_bleed.isSameObjectAs(p5_new_crop));
    assert(p5_new_media.unparse() == root_media_unparse);
    assert(p5_new_crop.unparse() == root_media_unparse);
    assert(p5_new_bleed.unparse() == root_media_unparse);
}